

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  size_t __n;
  u8 uVar8;
  u16 uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    return 0;
  }
  if (pMem->db == (sqlite3 *)0x0) {
    iVar7 = 1000000000;
  }
  else {
    iVar7 = pMem->db->aLimit[0];
  }
  uVar10 = 2;
  if (enc == '\0') {
    uVar10 = 0x10;
  }
  if (-1 < n) goto LAB_001204a9;
  if (enc == '\x01') {
    if (iVar7 < 0) {
LAB_00120496:
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)(iVar7 + 1);
      uVar6 = 0;
      do {
        if (z[uVar6] == '\0') {
          uVar11 = uVar6 & 0xffffffff;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
    }
  }
  else {
    if (iVar7 < 0) goto LAB_00120496;
    uVar11 = 0;
    do {
      if (z[uVar11 + 1] == '\0' && z[uVar11] == '\0') break;
      uVar11 = uVar11 + 2;
    } while ((int)uVar11 <= iVar7);
  }
  n = (int)uVar11;
  uVar10 = uVar10 | 0x200;
LAB_001204a9:
  uVar9 = (u16)uVar10;
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    iVar5 = 0;
    if (uVar10 >> 9 != 0) {
      iVar5 = (enc != '\x01') + 1;
    }
    if (iVar7 < n) {
      return 0x12;
    }
    iVar4 = sqlite3VdbeMemGrow(pMem,iVar5 + n,0);
    if (iVar4 != 0) {
      return 7;
    }
    memcpy(pMem->z,z,(long)(iVar5 + n));
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    if (xDel == sqlite3MallocSize) {
      pMem->zMalloc = z;
      pMem->xDel = (_func_void_void_ptr *)0x0;
    }
    else {
      pMem->xDel = xDel;
      uVar9 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar9 + 0x400;
    }
  }
  pMem->n = n;
  pMem->flags = uVar9;
  uVar8 = '\x01';
  if (1 < enc) {
    uVar8 = enc;
  }
  pMem->enc = uVar8;
  pMem->type = (enc == '\0') + '\x03';
  if ((1 < enc) && (1 < n)) {
    cVar2 = *pMem->z;
    cVar3 = pMem->z[1];
    uVar8 = '\x02';
    if ((cVar3 == -2 && cVar2 == -1) || (uVar8 = '\x03', cVar3 == -1 && cVar2 == -2)) {
      iVar5 = sqlite3VdbeMemMakeWriteable(pMem);
      if (iVar5 != 0) {
        return 7;
      }
      __n = (long)pMem->n - 2;
      pMem->n = (int)__n;
      memmove(pMem->z,pMem->z + 2,__n);
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 | 2;
      pMem->enc = uVar8;
    }
  }
  iVar5 = 0;
  if (iVar7 < n) {
    iVar5 = 0x12;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags & MEM_RowSet)==0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      for(nByte=0; nByte<=iLimit && z[nByte]; nByte++){}
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    int nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return SQLITE_TOOBIG;
    }
    if( sqlite3VdbeMemGrow(pMem, nAlloc, 0) ){
      return SQLITE_NOMEM;
    }
    memcpy(pMem->z, z, nAlloc);
  }else if( xDel==SQLITE_DYNAMIC ){
    sqlite3VdbeMemRelease(pMem);
    pMem->zMalloc = pMem->z = (char *)z;
    pMem->xDel = 0;
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    pMem->xDel = xDel;
    flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);
  pMem->type = (enc==0 ? SQLITE_BLOB : SQLITE_TEXT);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}